

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

void entryClose(UResourceDataEntry *resB)

{
  UResourceDataEntry *resB_local;
  
  umtx_lock_63(&resbMutex);
  entryCloseInt(resB);
  umtx_unlock_63(&resbMutex);
  return;
}

Assistant:

static void entryClose(UResourceDataEntry *resB) {
  umtx_lock(&resbMutex);
  entryCloseInt(resB);
  umtx_unlock(&resbMutex);
}